

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::GetRootObject(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  RootObjectBase *pRVar4;
  RootObjectBase *pRVar5;
  undefined4 *puVar6;
  Var rootObject;
  InterpreterStackFrame *this_local;
  
  pFVar3 = GetFunctionBody(this);
  bVar2 = FunctionProxy::IsJsBuiltInCode((FunctionProxy *)pFVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2173,"(!this->GetFunctionBody()->IsJsBuiltInCode())",
                                "!this->GetFunctionBody()->IsJsBuiltInCode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pRVar4 = (RootObjectBase *)GetReg<unsigned_int>(this,1);
  pFVar3 = GetFunctionBody(this);
  pRVar5 = FunctionBody::LoadRootObject(pFVar3);
  if (pRVar4 != pRVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2175,"(rootObject == this->GetFunctionBody()->LoadRootObject())",
                                "rootObject == this->GetFunctionBody()->LoadRootObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return pRVar4;
}

Assistant:

Var InterpreterStackFrame::GetRootObject() const
    {
        Assert(!this->GetFunctionBody()->IsJsBuiltInCode());
        Var rootObject = GetReg(Js::FunctionBody::RootObjectRegSlot);
        Assert(rootObject == this->GetFunctionBody()->LoadRootObject());
        return rootObject;
    }